

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Structure * __thiscall soul::AST::StructDeclaration::getStruct(StructDeclaration *this)

{
  bool bVar1;
  string *psVar2;
  Expression *pEVar3;
  Structure *pSVar4;
  string local_98;
  Type local_78;
  Member *local_60;
  Member *m;
  Member *__end3;
  Member *__begin3;
  ArrayWithPreallocation<soul::AST::StructDeclaration::Member,_16UL> *__range3;
  string local_30;
  StructDeclaration *local_10;
  StructDeclaration *this_local;
  
  local_10 = this;
  bVar1 = RefCountedPtr<soul::Structure>::operator==(&this->structure,(Structure *)0x0);
  if (bVar1) {
    pSVar4 = (Structure *)operator_new(0x288);
    __range3._3_1_ = 1;
    psVar2 = Identifier::toString_abi_cxx11_(&(this->super_TypeDeclarationBase).name);
    std::__cxx11::string::string((string *)&local_30,(string *)psVar2);
    Structure::Structure(pSVar4,&local_30,this);
    __range3._3_1_ = 0;
    RefCountedPtr<soul::Structure>::reset(&this->structure,pSVar4);
    std::__cxx11::string::~string((string *)&local_30);
    __begin3 = (Member *)&this->members;
    __end3 = ArrayWithPreallocation<soul::AST::StructDeclaration::Member,_16UL>::begin
                       ((ArrayWithPreallocation<soul::AST::StructDeclaration::Member,_16UL> *)
                        __begin3);
    m = ArrayWithPreallocation<soul::AST::StructDeclaration::Member,_16UL>::end
                  ((ArrayWithPreallocation<soul::AST::StructDeclaration::Member,_16UL> *)__begin3);
    for (; __end3 != m; __end3 = __end3 + 1) {
      local_60 = __end3;
      pSVar4 = RefCountedPtr<soul::Structure>::operator->(&this->structure);
      pEVar3 = pool_ref<soul::AST::Expression>::operator->(&local_60->type);
      (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[5])(&local_78);
      psVar2 = Identifier::toString_abi_cxx11_(&local_60->name);
      std::__cxx11::string::string((string *)&local_98,(string *)psVar2);
      Structure::addMember(pSVar4,&local_78,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      Type::~Type(&local_78);
    }
  }
  pSVar4 = RefCountedPtr<soul::Structure>::operator*(&this->structure);
  return pSVar4;
}

Assistant:

Structure& getStruct() const
        {
            if (structure == nullptr)
            {
                structure.reset (new Structure (name.toString(), const_cast<StructDeclaration*> (this)));

                for (auto& m : members)
                    structure->addMember (m.type->resolveAsType(), m.name.toString());
            }

            return *structure;
        }